

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::
allocate<unsigned_int&,spv::StorageClass,int,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRVariable> *this,uint *p,StorageClass *p_1,int *p_2,uint *p_3)

{
  Vector<spirv_cross::SPIRVariable_*> *this_00;
  uint uVar1;
  StorageClass SVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  _Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
  _Var6;
  _Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> _Var7;
  SPIRVariable *pSVar8;
  ulong count;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var6.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>)malloc(count * 0xb0);
    if (_Var6.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
        (SPIRVariable *)0x0) {
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve(this_00,count);
      _Var7._M_head_impl =
           (SPIRVariable *)
           _Var6.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRVariable_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                           + 1);
        sVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar5] =
             _Var7._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = sVar5 + 1;
        _Var7._M_head_impl = _Var7._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
                .buffer_size + 1);
      sVar5 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .ptr[sVar5]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRVariable_*,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false> =
           _Var6.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRVariable,_spirv_cross::ObjectPool<spirv_cross::SPIRVariable>::MallocDeleter>_>
      .buffer_size = sVar5 + 1;
      if (_Var6.super__Head_base<0UL,_spirv_cross::SPIRVariable_*,_false>._M_head_impl !=
          (SPIRVariable *)0x0) goto LAB_0028da41;
    }
    pSVar8 = (SPIRVariable *)0x0;
  }
  else {
LAB_0028da41:
    sVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
    pSVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar5 - 1];
    if (sVar5 != 0) {
      SmallVector<spirv_cross::SPIRVariable_*,_0UL>::resize(this_00,sVar5 - 1);
    }
    uVar1 = *p;
    SVar2 = *p_1;
    uVar3 = *p_2;
    uVar4 = *p_3;
    (pSVar8->super_IVariant).self.id = 0;
    (pSVar8->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRVariable_0049df90;
    *(uint *)&(pSVar8->super_IVariant).field_0xc = uVar1;
    pSVar8->storage = SVar2;
    pSVar8->decoration = 0;
    (pSVar8->initializer).id = uVar3;
    (pSVar8->basevariable).id = uVar4;
    (pSVar8->dereference_chain).super_VectorView<unsigned_int>.ptr = (uint *)0x0;
    (pSVar8->dereference_chain).super_VectorView<unsigned_int>.buffer_size = 0;
    (pSVar8->dereference_chain).super_VectorView<unsigned_int>.ptr =
         (uint *)&(pSVar8->dereference_chain).stack_storage;
    (pSVar8->dereference_chain).buffer_capacity = 8;
    pSVar8->compat_builtin = false;
    pSVar8->statically_assigned = false;
    *(undefined8 *)&pSVar8->static_expression = 0;
    *(undefined8 *)
     ((long)&(pSVar8->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
     + 4) = 0;
    (pSVar8->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size =
         0;
    (pSVar8->dependees).buffer_capacity = 0;
    (pSVar8->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar8->dependees).stack_storage;
    (pSVar8->dependees).buffer_capacity = 8;
    pSVar8->parameter = (Parameter *)0x0;
    *(undefined8 *)((long)&pSVar8->remapped_components + 3) = 0;
    pSVar8->deferred_declaration = false;
    pSVar8->phi_variable = false;
    pSVar8->allocate_temporary_copy = false;
    pSVar8->remapped_variable = false;
    pSVar8->remapped_components = 0;
  }
  return pSVar8;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}